

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterWriteDTDExternalEntityContents
              (xmlTextWriterPtr writer,xmlChar *pubid,xmlChar *sysid,xmlChar *ndataid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlLinkPtr lk;
  void *pvVar6;
  char *msg;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (xmlNode *)0x0,0x19,1,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                  (char *)0x0,0,0,"%s",
                  "xmlTextWriterWriteDTDExternalEntityContents: xmlTextWriterPtr invalid!\n");
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  if (lk == (xmlLinkPtr)0x0) {
    xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterWriteDTDExternalEntityContents: you must call xmlTextWriterStartDTDEntity before the call to this function!\n"
                   );
    return -1;
  }
  pvVar6 = xmlLinkGetData(lk);
  if (pvVar6 == (void *)0x0) {
    return -1;
  }
  if (*(int *)((long)pvVar6 + 8) != 0xd) {
    if (*(int *)((long)pvVar6 + 8) != 0xf) {
      msg = 
      "xmlTextWriterWriteDTDExternalEntityContents: you must call xmlTextWriterStartDTDEntity before the call to this function!\n"
      ;
      goto LAB_001b59d2;
    }
    if (ndataid != (xmlChar *)0x0) {
      msg = 
      "xmlTextWriterWriteDTDExternalEntityContents: notation not allowed with parameter entities!\n"
      ;
      goto LAB_001b59d2;
    }
  }
  if (pubid == (xmlChar *)0x0) {
    if (sysid == (xmlChar *)0x0) {
      iVar1 = 0;
      goto LAB_001b59f3;
    }
    iVar2 = xmlOutputBufferWriteString(writer->out," SYSTEM");
    if (iVar2 < 0) {
      return -1;
    }
  }
  else {
    if (sysid == (xmlChar *)0x0) {
      msg = "xmlTextWriterWriteDTDExternalEntityContents: system identifier needed!\n";
LAB_001b59d2:
      xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,msg);
      return -1;
    }
    iVar1 = xmlOutputBufferWriteString(writer->out," PUBLIC ");
    if (iVar1 < 0) {
      return -1;
    }
    iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
    if (iVar2 < 0) {
      return -1;
    }
    iVar3 = xmlOutputBufferWriteString(writer->out,(char *)pubid);
    if (iVar3 < 0) {
      return -1;
    }
    iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
    if (iVar4 < 0) {
      return -1;
    }
    iVar2 = iVar3 + iVar4 + iVar2 + iVar1;
  }
  iVar3 = xmlOutputBufferWriteString(writer->out," ");
  if (iVar3 < 0) {
    return -1;
  }
  iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
  if (iVar4 < 0) {
    return -1;
  }
  iVar5 = xmlOutputBufferWriteString(writer->out,(char *)sysid);
  if (iVar5 < 0) {
    return -1;
  }
  iVar1 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = iVar4 + iVar5 + iVar3 + iVar2 + iVar1;
LAB_001b59f3:
  if (ndataid == (xmlChar *)0x0) {
    return iVar1;
  }
  iVar2 = xmlOutputBufferWriteString(writer->out," NDATA ");
  if (-1 < iVar2) {
    iVar3 = xmlOutputBufferWriteString(writer->out,(char *)ndataid);
    if (-1 < iVar3) {
      return iVar2 + iVar1 + iVar3;
    }
    return -1;
  }
  return -1;
}

Assistant:

int
xmlTextWriterWriteDTDExternalEntityContents(xmlTextWriterPtr writer,
                                            const xmlChar * pubid,
                                            const xmlChar * sysid,
                                            const xmlChar * ndataid)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteDTDExternalEntityContents: xmlTextWriterPtr invalid!\n");
        return -1;
    }

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteDTDExternalEntityContents: you must call xmlTextWriterStartDTDEntity before the call to this function!\n");
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return -1;

    switch (p->state) {
        case XML_TEXTWRITER_DTD_ENTY:
            break;
        case XML_TEXTWRITER_DTD_PENT:
            if (ndataid != NULL) {
                xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                                "xmlTextWriterWriteDTDExternalEntityContents: notation not allowed with parameter entities!\n");
                return -1;
            }
            break;
        default:
            xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterWriteDTDExternalEntityContents: you must call xmlTextWriterStartDTDEntity before the call to this function!\n");
            return -1;
    }

    if (pubid != 0) {
        if (sysid == 0) {
            xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterWriteDTDExternalEntityContents: system identifier needed!\n");
            return -1;
        }

        count = xmlOutputBufferWriteString(writer->out, " PUBLIC ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) pubid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (sysid != 0) {
        if (pubid == 0) {
            count = xmlOutputBufferWriteString(writer->out, " SYSTEM");
            if (count < 0)
                return -1;
            sum += count;
        }

        count = xmlOutputBufferWriteString(writer->out, " ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) sysid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (ndataid != NULL) {
        count = xmlOutputBufferWriteString(writer->out, " NDATA ");
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out,
                                       (const char *) ndataid);
        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}